

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool cmsys::SystemTools::RemoveADirectory(string *source)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  unsigned_long uVar4;
  char *pcVar5;
  undefined1 local_60 [8];
  string fullPath;
  size_t fileNum;
  Directory local_28;
  Directory dir;
  mode_t mode;
  string *source_local;
  
  bVar2 = GetPermissions(source,(mode_t *)((long)&dir.Internal + 4));
  if (bVar2) {
    dir.Internal._4_4_ = dir.Internal._4_4_ | 0x80;
    SetPermissions(source,dir.Internal._4_4_,false);
  }
  Directory::Directory(&local_28);
  Directory::Load(&local_28,source);
  for (fullPath.field_2._8_8_ = 0; uVar1 = fullPath.field_2._8_8_,
      uVar4 = Directory::GetNumberOfFiles(&local_28), (ulong)uVar1 < uVar4;
      fullPath.field_2._8_8_ = fullPath.field_2._8_8_ + 1) {
    pcVar5 = Directory::GetFile(&local_28,fullPath.field_2._8_8_);
    iVar3 = strcmp(pcVar5,".");
    if (iVar3 != 0) {
      pcVar5 = Directory::GetFile(&local_28,fullPath.field_2._8_8_);
      iVar3 = strcmp(pcVar5,"..");
      if (iVar3 != 0) {
        std::__cxx11::string::string((string *)local_60,(string *)source);
        std::__cxx11::string::operator+=((string *)local_60,"/");
        pcVar5 = Directory::GetFile(&local_28,fullPath.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_60,pcVar5);
        bVar2 = FileIsDirectory((string *)local_60);
        if ((!bVar2) || (bVar2 = FileIsSymlink((string *)local_60), bVar2)) {
          bVar2 = RemoveFile((string *)local_60);
          if (bVar2) {
LAB_00678cfb:
            bVar2 = false;
          }
          else {
            source_local._7_1_ = 0;
            bVar2 = true;
          }
        }
        else {
          bVar2 = RemoveADirectory((string *)local_60);
          if (bVar2) goto LAB_00678cfb;
          source_local._7_1_ = 0;
          bVar2 = true;
        }
        std::__cxx11::string::~string((string *)local_60);
        if (bVar2) goto LAB_00678d52;
      }
    }
  }
  iVar3 = Rmdir(source);
  source_local._7_1_ = iVar3 == 0;
LAB_00678d52:
  Directory::~Directory(&local_28);
  return (bool)(source_local._7_1_ & 1);
}

Assistant:

bool SystemTools::RemoveADirectory(const std::string& source)
{
  // Add write permission to the directory so we can modify its
  // content to remove files and directories from it.
  mode_t mode;
  if (SystemTools::GetPermissions(source, mode)) {
#if defined(_WIN32) && !defined(__CYGWIN__)
    mode |= S_IWRITE;
#else
    mode |= S_IWUSR;
#endif
    SystemTools::SetPermissions(source, mode);
  }

  Directory dir;
  dir.Load(source);
  size_t fileNum;
  for (fileNum = 0; fileNum < dir.GetNumberOfFiles(); ++fileNum) {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), ".") &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)), "..")) {
      std::string fullPath = source;
      fullPath += "/";
      fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
      if (SystemTools::FileIsDirectory(fullPath) &&
          !SystemTools::FileIsSymlink(fullPath)) {
        if (!SystemTools::RemoveADirectory(fullPath)) {
          return false;
        }
      } else {
        if (!SystemTools::RemoveFile(fullPath)) {
          return false;
        }
      }
    }
  }

  return (Rmdir(source) == 0);
}